

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepro_prod.h
# Opt level: O2

FlatExpr * __thiscall
mp::
PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
::CombineOrderedFactors
          (FlatExpr *__return_storage_ptr__,
          PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
          *this)

{
  double dVar1;
  uint uVar2;
  ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pPVar3;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
  *this_00;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Arguments args_forall;
  int binvar;
  double local_278;
  _Vector_base<int,_std::allocator<int>_> local_268;
  _Vector_base<int,_std::allocator<int>_> local_250;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
  local_238;
  QuadraticExpr local_1f0;
  
  QuadAndLinTerms::QuadAndLinTerms((QuadAndLinTerms *)__return_storage_ptr__);
  (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = 1.0;
  lVar5 = 0;
  uVar2 = this->n_terms_const_;
  if (this->n_terms_const_ < 1) {
    uVar2 = 0;
  }
  uVar6 = (ulong)uVar2;
  local_278 = 1.0;
  for (; uVar6 * 0x1e0 - lVar5 != 0; lVar5 = lVar5 + 0x1e0) {
    local_278 = local_278 *
                *(double *)
                 ((long)&(((this->terms_flt_).
                           super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                           .m_data.
                           super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                          .m_data_ptr)->
                         super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                         ).super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                         super__Head_base<1UL,_mp::EExpr,_false> + lVar5 + 0xfffffffffffffff0U);
  }
  uVar2 = this->n_terms_binary_;
  if ((ulong)uVar2 == 2) {
    bVar4 = (byte)(this->flt_->
                  super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  ).prepro_products_ & 2;
  }
  else {
    if ((int)uVar2 < 3) goto LAB_00229e05;
    bVar4 = (byte)(this->flt_->
                  super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  ).prepro_products_ & 4;
  }
  if (bVar4 != 0) {
    local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)&local_268,(ulong)uVar2);
    uVar7 = uVar6 * 0x1e0 | 0x10;
    for (; (long)uVar6 < (long)this->n_terms_binary_ + (long)this->n_terms_const_; uVar6 = uVar6 + 1
        ) {
      local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p._0_4_ =
           FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::Convert2Var(&(this->flt_->
                          super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ).flat_cvt_.
                          super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         ,(QuadraticExpr *)
                          ((long)&(((this->terms_flt_).
                                    super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                                    .m_data.
                                    super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                                   .m_data_ptr)->
                                  super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                                  ).super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                                  super__Head_base<1UL,_mp::EExpr,_false> +
                          uVar7 + 0xfffffffffffffff0));
      dVar1 = *(double *)
               ((long)&(((this->terms_flt_).
                         super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                         .m_data.
                         super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                        .m_data_ptr)->
                       super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                       ).super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                       super__Head_base<1UL,_mp::EExpr,_false> + uVar7 + 0xffffffffffffffe0);
      if ((dVar1 == -1.0) && (!NAN(dVar1))) {
        pPVar3 = this->flt_;
        EExpr::EExpr((EExpr *)&local_1f0,-1.0,
                     (int)local_238.super_FunctionalConstraint.super_BasicConstraint.name_.
                          _M_dataplus._M_p);
        local_238.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p._0_4_ =
             FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::Convert2Var(&(pPVar3->
                            super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                            ).flat_cvt_.
                            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           ,&local_1f0);
        local_278 = -local_278;
        QuadAndLinTerms::~QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms);
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_268,(value_type *)&local_238);
      uVar7 = uVar7 + 0x1e0;
    }
    this_00 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
               *)this->flt_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_250,
               (vector<int,_std::allocator<int>_> *)&local_268);
    CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
    ::CustomFunctionalConstraint(&local_238,(Arguments *)&local_250);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::AndId>>
              ((EExpr *)&local_1f0,this_00,&local_238);
    AlgebraicExpression<mp::QuadAndLinTerms>::operator=
              (&__return_storage_ptr__->super_QuadraticExpr,&local_1f0);
    QuadAndLinTerms::~QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms);
    CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
    ::~CustomFunctionalConstraint(&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_250);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_268);
  }
LAB_00229e05:
  AlgebraicExpression<mp::QuadAndLinTerms>::operator*=
            (&__return_storage_ptr__->super_QuadraticExpr,local_278);
  uVar6 = uVar6 & 0xffffffff;
  uVar7 = uVar6 * 0x1e0 | 0x10;
  for (; (long)uVar6 <
         (long)(int)(this->terms_flt_).
                    super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                    .m_data.
                    super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                    .m_size; uVar6 = uVar6 + 1) {
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::QuadratizeOrLinearize
              ((EExpr *)&local_1f0,
               &this->flt_->
                super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ,__return_storage_ptr__,
               (EExpr *)((long)&(((this->terms_flt_).
                                  super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                                  .m_data.
                                  super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                                 .m_data_ptr)->
                                super__Tuple_impl<0UL,_std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>
                                ).super__Tuple_impl<1UL,_mp::EExpr,_std::pair<double,_double>_>.
                                super__Head_base<1UL,_mp::EExpr,_false> + uVar7 + 0xfffffffffffffff0
                        ));
    AlgebraicExpression<mp::QuadAndLinTerms>::operator=
              (&__return_storage_ptr__->super_QuadraticExpr,&local_1f0);
    QuadAndLinTerms::~QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms);
    uVar7 = uVar7 + 0x1e0;
  }
  return __return_storage_ptr__;
}

Assistant:

FlatExpr CombineOrderedFactors() {
    FlatExpr result = typename FlatExpr::Constant {1.0};
    int i=0;
    double coef00 = 1.0;

    for ( ; i<n_terms_const_; ++i) {      // Collect constant factors
      // no: can have constant args
      // assert(std::get<1>(terms_flt_[i]).is_constant());
      auto bnds = std::get<2>(terms_flt_[i]);
      assert(bnds.first == bnds.second);
      coef00 *= bnds.first;
    }

    if ((n_terms_binary_==2 && GetFlt().prepro_products()&2) ||
        (n_terms_binary_>=3 && GetFlt().prepro_products()&4)) {
      AndConstraint::Arguments args_forall;
      args_forall.reserve(n_terms_binary_);   // Logicalize binary product
      for ( ; i<n_terms_const_+n_terms_binary_; ++i) {
        assert(1.0 ==                 // term bounds range 1
               std::get<2>(terms_flt_[i]).second -
                   std::get<2>(terms_flt_[i]).first );
        int binvar = GetFlt().Convert2Var(std::move(std::get<1>(terms_flt_[i])));
        auto is_lb_minus1 = (-1.0 == std::get<2>(terms_flt_[i]).first);
        if (is_lb_minus1) {    // negated binary
          coef00 *= -1;
          binvar = GetFlt().Convert2Var( { {-1.0}, {binvar} } );
        } else {
          assert(0.0 == std::get<2>(terms_flt_[i]).first); // normal binary
        }
        args_forall.push_back( binvar );
      }
      result = GetFlt().AssignResult2Args( AndConstraint{args_forall} );
      // Context should be set when adding the top contraint
    }

    result *= coef00;

    for ( ; i<(int)terms_flt_.size(); ++i) {
      result = GetFlt().QuadratizeOrLinearize(
          result, std::get<1>(terms_flt_[i]));
    }

    return result;
  }